

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

local_internals * pybind11::detail::get_local_internals(void)

{
  int iVar1;
  local_internals *plVar2;
  local_internals *in_stack_00000070;
  
  if (get_local_internals()::locals == '\0') {
    iVar1 = __cxa_guard_acquire(&get_local_internals()::locals);
    if (iVar1 != 0) {
      plVar2 = (local_internals *)operator_new(0x48);
      local_internals::local_internals(in_stack_00000070);
      get_local_internals::locals = plVar2;
      __cxa_guard_release(&get_local_internals()::locals);
    }
  }
  return get_local_internals::locals;
}

Assistant:

inline local_internals &get_local_internals() {
    // Current static can be created in the interpreter finalization routine. If the later will be
    // destroyed in another static variable destructor, creation of this static there will cause
    // static deinitialization fiasco. In order to avoid it we avoid destruction of the
    // local_internals static. One can read more about the problem and current solution here:
    // https://google.github.io/styleguide/cppguide.html#Static_and_Global_Variables
    static auto *locals = new local_internals();
    return *locals;
}